

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O3

endpoint __thiscall booster::aio::basic_socket::remote_endpoint(basic_socket *this)

{
  error_code *in_RSI;
  error_code e;
  
  std::_V2::system_category();
  remote_endpoint(this,in_RSI);
  return (endpoint)(copy_ptr<booster::aio::endpoint::data>)this;
}

Assistant:

endpoint basic_socket::remote_endpoint()
{
	system::error_code e;
	endpoint ep=remote_endpoint(e);
	if(e) throw system::system_error(e);
	return ep;
}